

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O1

void __thiscall icu_63::RBBIRuleScanner::fixOpStack(RBBIRuleScanner *this,OpPrecedence p)

{
  UErrorCode *pUVar1;
  UParseError *pUVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  RBBINode **ppRVar6;
  RBBINode *this_00;
  undefined4 in_register_00000034;
  RBBIRuleBuilder *pRVar7;
  OpPrecedence OVar8;
  OpPrecedence OVar9;
  
  pRVar7 = (RBBIRuleBuilder *)CONCAT44(in_register_00000034,p);
  OVar8 = precOpOr;
  if (3 < (int)p) {
    OVar8 = p;
  }
  lVar3 = (long)this->fNodeStackPtr;
  this_00 = this->fNodeStack[lVar3 + -1];
  OVar9 = this_00->fPrecedence;
  if (OVar9 != precZero) {
    uVar5 = lVar3 - 1;
    ppRVar6 = this->fNodeStack + lVar3;
    lVar3 = lVar3 << 0x20;
    do {
      iVar4 = (int)uVar5;
      if ((int)OVar9 < (int)OVar8) {
        if (2 < (int)p) {
          return;
        }
        if (OVar9 != p) {
          pRVar7 = this->fRB;
          if (*pRVar7->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            *pRVar7->fStatus = U_BRK_MISMATCHED_PAREN;
            pRVar7 = (RBBIRuleBuilder *)pRVar7->fParseError;
            if (pRVar7 != (RBBIRuleBuilder *)0x0) {
              *(int32_t *)&pRVar7->_vptr_RBBIRuleBuilder = this->fLineNum;
              *(int32_t *)((long)&pRVar7->_vptr_RBBIRuleBuilder + 4) = this->fCharNum;
              *(undefined2 *)&pRVar7->fDebugEnv = 0;
              *(undefined2 *)&(pRVar7->fStrippedRules).super_Replaceable.super_UObject._vptr_UObject
                   = 0;
            }
          }
        }
        ppRVar6[-1] = (RBBINode *)*(long *)((long)this->fNodeStack + (lVar3 >> 0x1d));
        this->fNodeStackPtr = iVar4;
        if (this_00 == (RBBINode *)0x0) {
          return;
        }
        RBBINode::~RBBINode(this_00);
        UMemory::operator_delete((UMemory *)this_00,pRVar7);
        return;
      }
      this_00->fRightChild = *ppRVar6;
      (*ppRVar6)->fParent = this_00;
      this->fNodeStackPtr = iVar4;
      this_00 = ppRVar6[-2];
      OVar9 = this_00->fPrecedence;
      lVar3 = lVar3 + -0x100000000;
      ppRVar6 = ppRVar6 + -1;
      uVar5 = (ulong)(iVar4 - 1);
    } while (OVar9 != precZero);
  }
  pRVar7 = this->fRB;
  pUVar1 = pRVar7->fStatus;
  if (*pUVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
    *pUVar1 = U_BRK_ERROR_START;
    pUVar2 = pRVar7->fParseError;
    if (pUVar2 != (UParseError *)0x0) {
      pUVar2->line = this->fLineNum;
      pUVar2->offset = this->fCharNum;
      pUVar2->preContext[0] = L'\0';
      pUVar2->postContext[0] = L'\0';
    }
  }
  return;
}

Assistant:

void RBBIRuleScanner::fixOpStack(RBBINode::OpPrecedence p) {
    RBBINode *n;
    // printNodeStack("entering fixOpStack()");
    for (;;) {
        n = fNodeStack[fNodeStackPtr-1];   // an operator node
        if (n->fPrecedence == 0) {
            RBBIDebugPuts("RBBIRuleScanner::fixOpStack, bad operator node");
            error(U_BRK_INTERNAL_ERROR);
            return;
        }

        if (n->fPrecedence < p || n->fPrecedence <= RBBINode::precLParen) {
            // The most recent operand goes with the current operator,
            //   not with the previously stacked one.
            break;
        }
            // Stack operator is a binary op  ( '|' or concatenation)
            //   TOS operand becomes right child of this operator.
            //   Resulting subexpression becomes the TOS operand.
            n->fRightChild = fNodeStack[fNodeStackPtr];
            fNodeStack[fNodeStackPtr]->fParent = n;
            fNodeStackPtr--;
        // printNodeStack("looping in fixOpStack()   ");
    }

    if (p <= RBBINode::precLParen) {
        // Scan is at a right paren or end of expression.
        //  The scanned item must match the stack, or else there was an error.
        //  Discard the left paren (or start expr) node from the stack,
            //  leaving the completed (sub)expression as TOS.
            if (n->fPrecedence != p) {
                // Right paren encountered matched start of expression node, or
                // end of expression matched with a left paren node.
                error(U_BRK_MISMATCHED_PAREN);
            }
            fNodeStack[fNodeStackPtr-1] = fNodeStack[fNodeStackPtr];
            fNodeStackPtr--;
            // Delete the now-discarded LParen or Start node.
            delete n;
    }
    // printNodeStack("leaving fixOpStack()");
}